

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Prepare(sqlite3 *db,char *zSql,int nBytes,u32 prepFlags,Vdbe *pReprepare,
                  sqlite3_stmt **ppStmt,char **pzTail)

{
  int iVar1;
  char *pcVar2;
  byte in_CL;
  int in_EDX;
  long in_RSI;
  sqlite3 *in_RDI;
  Parse *in_R8;
  long *in_R9;
  long in_FS_OFFSET;
  long *in_stack_00000008;
  TriggerPrg *pT;
  int mxLen;
  char *zSqlCopy;
  char *zDb;
  Btree *pBt;
  int i;
  int rc;
  Parse sParse;
  undefined4 in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdec;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  char *in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffe00;
  int in_stack_fffffffffffffe04;
  int local_1e0;
  uint local_1dc;
  undefined1 local_1b0 [8];
  char *local_1a8;
  Vdbe *local_1a0;
  uint local_198;
  u8 local_193;
  u8 local_18c;
  TriggerPrg *local_f0;
  undefined1 auStack_90 [19];
  u8 local_7d;
  char *local_58;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_1b0,0xaa,0x1a8);
  memset(&local_1a8,0,0xe0);
  memset(auStack_90,0,0x88);
  in_RDI->pParse = (Parse *)local_1b0;
  if (in_R8 != (Parse *)0x0) {
    iVar1 = sqlite3_stmt_isexplain((sqlite3_stmt *)in_R8);
    local_7d = (u8)iVar1;
  }
  if (in_RDI->mallocFailed == '\0') {
    if ((in_CL & 1) != 0) {
      local_18c = local_18c + '\x01';
      (in_RDI->lookaside).bDisable = (in_RDI->lookaside).bDisable + 1;
      (in_RDI->lookaside).sz = 0;
    }
    if (in_RDI->noSharedCache == '\0') {
      for (local_1e0 = 0; local_1e0 < in_RDI->nDb; local_1e0 = local_1e0 + 1) {
        if ((in_RDI->aDb[local_1e0].pBt != (Btree *)0x0) &&
           (local_1dc = sqlite3BtreeSchemaLocked
                                  ((Btree *)CONCAT44(in_stack_fffffffffffffdf4,
                                                     in_stack_fffffffffffffdf0)), local_1dc != 0)) {
          sqlite3ErrorWithMsg(in_RDI,(int)(ulong)local_1dc,"database schema is locked: %s",
                              in_RDI->aDb[local_1e0].zDbSName);
          goto LAB_0019da21;
        }
      }
    }
    if (in_RDI->pDisconnect != (VTable *)0x0) {
      sqlite3VtabUnlockList
                ((sqlite3 *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
    }
    if ((in_EDX < 0) || ((in_EDX != 0 && (*(char *)(in_RSI + (in_EDX + -1)) == '\0')))) {
      sqlite3RunParser(in_R8,(char *)in_R9);
    }
    else {
      in_stack_fffffffffffffe04 = in_RDI->aLimit[1];
      if (in_stack_fffffffffffffe04 < in_EDX) {
        sqlite3ErrorWithMsg(in_RDI,0x12,"statement too long");
        local_1dc = sqlite3ApiExit((sqlite3 *)
                                   CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),0);
        goto LAB_0019da21;
      }
      pcVar2 = sqlite3DbStrNDup((sqlite3 *)
                                CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                                in_stack_fffffffffffffdf8,
                                CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
      if (pcVar2 == (char *)0x0) {
        local_58 = (char *)(in_RSI + in_EDX);
      }
      else {
        sqlite3RunParser(in_R8,(char *)in_R9);
        local_58 = local_58 + (in_RSI - (long)pcVar2);
        sqlite3DbFree((sqlite3 *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                      (void *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
      }
    }
    if (in_stack_00000008 != (long *)0x0) {
      *in_stack_00000008 = (long)local_58;
    }
    if ((in_RDI->init).busy == '\0') {
      sqlite3VdbeSetSql((Vdbe *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                        (char *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),0,'\0'
                       );
    }
    if (in_RDI->mallocFailed != '\0') {
      local_198 = 7;
      local_193 = '\0';
    }
    if ((local_198 == 0) || (local_198 == 0x65)) {
      *in_R9 = (long)local_1a0;
      local_1dc = 0;
      sqlite3ErrorClear((sqlite3 *)0x19d9e3);
    }
    else {
      if ((local_193 != '\0') && ((in_RDI->init).busy == '\0')) {
        schemaIsValid((Parse *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
      }
      if (local_1a0 != (Vdbe *)0x0) {
        sqlite3VdbeFinalize((Vdbe *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
      }
      local_1dc = local_198;
      if (local_1a8 == (char *)0x0) {
        sqlite3Error((sqlite3 *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                     in_stack_fffffffffffffdec);
      }
      else {
        sqlite3ErrorWithMsg(in_RDI,(int)(ulong)local_198,"%s",local_1a8);
        sqlite3DbFree((sqlite3 *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                      (void *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
      }
    }
    while (local_f0 != (TriggerPrg *)0x0) {
      local_f0 = local_f0->pNext;
      sqlite3DbFree((sqlite3 *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                    (void *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
    }
  }
  else {
    sqlite3ErrorMsg((Parse *)local_1b0,"out of memory");
    local_1dc = 7;
    in_RDI->errCode = 7;
  }
LAB_0019da21:
  sqlite3ParseObjectReset((Parse *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_1dc;
}

Assistant:

static int sqlite3Prepare(
  sqlite3 *db,              /* Database handle. */
  const char *zSql,         /* UTF-8 encoded SQL statement. */
  int nBytes,               /* Length of zSql in bytes. */
  u32 prepFlags,            /* Zero or more SQLITE_PREPARE_* flags */
  Vdbe *pReprepare,         /* VM being reprepared */
  sqlite3_stmt **ppStmt,    /* OUT: A pointer to the prepared statement */
  const char **pzTail       /* OUT: End of parsed string */
){
  int rc = SQLITE_OK;       /* Result code */
  int i;                    /* Loop counter */
  Parse sParse;             /* Parsing context */

  /* sqlite3ParseObjectInit(&sParse, db); // inlined for performance */
  memset(PARSE_HDR(&sParse), 0, PARSE_HDR_SZ);
  memset(PARSE_TAIL(&sParse), 0, PARSE_TAIL_SZ);
  sParse.pOuterParse = db->pParse;
  db->pParse = &sParse;
  sParse.db = db;
  if( pReprepare ){
    sParse.pReprepare = pReprepare;
    sParse.explain = sqlite3_stmt_isexplain((sqlite3_stmt*)pReprepare);
  }else{
    assert( sParse.pReprepare==0 );
  }
  assert( ppStmt && *ppStmt==0 );
  if( db->mallocFailed ){
    sqlite3ErrorMsg(&sParse, "out of memory");
    db->errCode = rc = SQLITE_NOMEM;
    goto end_prepare;
  }
  assert( sqlite3_mutex_held(db->mutex) );

  /* For a long-term use prepared statement avoid the use of
  ** lookaside memory.
  */
  if( prepFlags & SQLITE_PREPARE_PERSISTENT ){
    sParse.disableLookaside++;
    DisableLookaside;
  }
  sParse.prepFlags = prepFlags & 0xff;

  /* Check to verify that it is possible to get a read lock on all
  ** database schemas.  The inability to get a read lock indicates that
  ** some other database connection is holding a write-lock, which in
  ** turn means that the other connection has made uncommitted changes
  ** to the schema.
  **
  ** Were we to proceed and prepare the statement against the uncommitted
  ** schema changes and if those schema changes are subsequently rolled
  ** back and different changes are made in their place, then when this
  ** prepared statement goes to run the schema cookie would fail to detect
  ** the schema change.  Disaster would follow.
  **
  ** This thread is currently holding mutexes on all Btrees (because
  ** of the sqlite3BtreeEnterAll() in sqlite3LockAndPrepare()) so it
  ** is not possible for another thread to start a new schema change
  ** while this routine is running.  Hence, we do not need to hold
  ** locks on the schema, we just need to make sure nobody else is
  ** holding them.
  **
  ** Note that setting READ_UNCOMMITTED overrides most lock detection,
  ** but it does *not* override schema lock detection, so this all still
  ** works even if READ_UNCOMMITTED is set.
  */
  if( !db->noSharedCache ){
    for(i=0; i<db->nDb; i++) {
      Btree *pBt = db->aDb[i].pBt;
      if( pBt ){
        assert( sqlite3BtreeHoldsMutex(pBt) );
        rc = sqlite3BtreeSchemaLocked(pBt);
        if( rc ){
          const char *zDb = db->aDb[i].zDbSName;
          sqlite3ErrorWithMsg(db, rc, "database schema is locked: %s", zDb);
          testcase( db->flags & SQLITE_ReadUncommit );
          goto end_prepare;
        }
      }
    }
  }

#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( db->pDisconnect ) sqlite3VtabUnlockList(db);
#endif

  if( nBytes>=0 && (nBytes==0 || zSql[nBytes-1]!=0) ){
    char *zSqlCopy;
    int mxLen = db->aLimit[SQLITE_LIMIT_SQL_LENGTH];
    testcase( nBytes==mxLen );
    testcase( nBytes==mxLen+1 );
    if( nBytes>mxLen ){
      sqlite3ErrorWithMsg(db, SQLITE_TOOBIG, "statement too long");
      rc = sqlite3ApiExit(db, SQLITE_TOOBIG);
      goto end_prepare;
    }
    zSqlCopy = sqlite3DbStrNDup(db, zSql, nBytes);
    if( zSqlCopy ){
      sqlite3RunParser(&sParse, zSqlCopy);
      sParse.zTail = &zSql[sParse.zTail-zSqlCopy];
      sqlite3DbFree(db, zSqlCopy);
    }else{
      sParse.zTail = &zSql[nBytes];
    }
  }else{
    sqlite3RunParser(&sParse, zSql);
  }
  assert( 0==sParse.nQueryLoop );

  if( pzTail ){
    *pzTail = sParse.zTail;
  }

  if( db->init.busy==0 ){
    sqlite3VdbeSetSql(sParse.pVdbe, zSql, (int)(sParse.zTail-zSql), prepFlags);
  }
  if( db->mallocFailed ){
    sParse.rc = SQLITE_NOMEM_BKPT;
    sParse.checkSchema = 0;
  }
  if( sParse.rc!=SQLITE_OK && sParse.rc!=SQLITE_DONE ){
    if( sParse.checkSchema && db->init.busy==0 ){
      schemaIsValid(&sParse);
    }
    if( sParse.pVdbe ){
      sqlite3VdbeFinalize(sParse.pVdbe);
    }
    assert( 0==(*ppStmt) );
    rc = sParse.rc;
    if( sParse.zErrMsg ){
      sqlite3ErrorWithMsg(db, rc, "%s", sParse.zErrMsg);
      sqlite3DbFree(db, sParse.zErrMsg);
    }else{
      sqlite3Error(db, rc);
    }
  }else{
    assert( sParse.zErrMsg==0 );
    *ppStmt = (sqlite3_stmt*)sParse.pVdbe;
    rc = SQLITE_OK;
    sqlite3ErrorClear(db);
  }


  /* Delete any TriggerPrg structures allocated while parsing this statement. */
  while( sParse.pTriggerPrg ){
    TriggerPrg *pT = sParse.pTriggerPrg;
    sParse.pTriggerPrg = pT->pNext;
    sqlite3DbFree(db, pT);
  }

end_prepare:

  sqlite3ParseObjectReset(&sParse);
  return rc;
}